

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_diff_hdrs(nt_opts *opts)

{
  nifti_1_header *s0;
  nifti_1_header *s1;
  uint local_2c;
  int diffs;
  nifti_1_header *nhdr1;
  nifti_1_header *nhdr0;
  nt_opts *opts_local;
  
  if ((opts->infiles).len == 2) {
    if (2 < g_debug) {
      fprintf(_stderr,"-d nifti_1_header diff between %s and %s...\n",*(opts->infiles).list);
    }
    s0 = nt_read_header(opts,*(opts->infiles).list,(int *)0x0,0);
    if (s0 == (nifti_1_header *)0x0) {
      opts_local._4_4_ = 1;
    }
    else {
      s1 = nt_read_header(opts,(opts->infiles).list[1],(int *)0x0,0);
      if (s1 == (nifti_1_header *)0x0) {
        free(s0);
        opts_local._4_4_ = 1;
      }
      else {
        if (1 < g_debug) {
          fprintf(_stderr,"\n-d nifti_1_header diffs between \'%s\' and \'%s\'...\n",
                  *(opts->infiles).list,(opts->infiles).list[1]);
        }
        if ((opts->flist).len < 1) {
          local_2c = diff_hdrs(s0,s1,(uint)(0 < g_debug));
        }
        else {
          local_2c = diff_hdrs_list(s0,s1,&opts->flist,(uint)(0 < g_debug));
        }
        if ((local_2c == 0) && (1 < g_debug)) {
          fprintf(_stderr,"+d no differences found\n");
        }
        else if (2 < g_debug) {
          fprintf(_stderr,"+d %d differences found\n",(ulong)local_2c);
        }
        free(s0);
        free(s1);
        opts_local._4_4_ = (uint)(0 < (int)local_2c);
      }
    }
  }
  else {
    fprintf(_stderr,"** -diff_hdr requires 2 -infiles, have %d\n",(ulong)(uint)(opts->infiles).len);
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

int act_diff_hdrs( nt_opts * opts )
{
   nifti_1_header * nhdr0, * nhdr1;
   int              diffs = 0;

   if( opts->infiles.len != 2 ){
      fprintf(stderr,"** -diff_hdr requires 2 -infiles, have %d\n",
              opts->infiles.len);
      return 1;
   }

   if( g_debug > 2 )
      fprintf(stderr,"-d nifti_1_header diff between %s and %s...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   /* get the nifiti headers (but do not validate them) */

   nhdr0 = nt_read_header(opts, opts->infiles.list[0], NULL, 0);
   if( ! nhdr0 ) return 1;  /* errors have been printed */

   nhdr1 = nt_read_header(opts, opts->infiles.list[1], NULL, 0);
   if( ! nhdr1 ){ free(nhdr0); return 1; }

   if( g_debug > 1 )
      fprintf(stderr,"\n-d nifti_1_header diffs between '%s' and '%s'...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   if( opts->flist.len <= 0 )
      diffs = diff_hdrs(nhdr0, nhdr1, g_debug > 0);
   else
      diffs = diff_hdrs_list(nhdr0, nhdr1, &opts->flist, g_debug > 0);

   if( diffs == 0 && g_debug > 1 )
      fprintf(stderr,"+d no differences found\n");
   else if ( g_debug > 2 )
      fprintf(stderr,"+d %d differences found\n", diffs);

   free(nhdr0);
   free(nhdr1);

   return (diffs > 0);
}